

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O2

void slang::ast::GenerateBlockSymbol::fromSyntax
               (Compilation *compilation,CaseGenerateSyntax *syntax,ASTContext *context,
               uint32_t constructIndex,bool isUninstantiated,
               SmallVectorBase<slang::ast::GenerateBlockSymbol_*> *results)

{
  pointer ppCVar1;
  CaseItemSyntax *pCVar2;
  long lVar3;
  Expression *expr;
  Expression *expr_00;
  span<const_slang::syntax::ExpressionSyntax_*const,_18446744073709551615UL> expressions_00;
  SourceRange range;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  Diagnostic *pDVar7;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes;
  pointer ppCVar8;
  pointer ppEVar9;
  bool bVar10;
  ASTContext *pAVar11;
  ulong uVar12;
  SourceRange sourceRange;
  Type *local_180;
  SourceLocation local_150;
  SourceLocation local_148;
  SourceLocation local_138;
  SourceLocation local_130;
  ASTContext *local_118;
  ConstantValue condVal;
  SmallVector<const_slang::ast::Expression_*,_5UL> bound;
  ConstantValue val;
  SmallVector<const_slang::syntax::ExpressionSyntax_*,_5UL> expressions;
  
  expressions.super_SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>.data_ =
       (pointer)expressions.super_SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>.
                firstElement;
  expressions.super_SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>.len = 0;
  expressions.super_SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>.cap = 5;
  ppCVar8 = (syntax->items).super_span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>.
            _M_ptr;
  ppCVar1 = ppCVar8 + (syntax->items).
                      super_span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>._M_extent.
                      _M_extent_value;
  local_118 = (ASTContext *)0x0;
  for (; ppCVar8 != ppCVar1; ppCVar8 = ppCVar8 + 1) {
    pCVar2 = *ppCVar8;
    if ((pCVar2->super_SyntaxNode).kind == StandardCaseItem) {
      bound.super_SmallVectorBase<const_slang::ast::Expression_*>.len = 0;
      lVar3 = *(long *)&pCVar2[3].super_SyntaxNode;
      bound.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ = (pointer)(pCVar2 + 1);
      for (; ((CaseItemSyntax *)bound.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ !=
              pCVar2 + 1 ||
             (bound.super_SmallVectorBase<const_slang::ast::Expression_*>.len != lVar3 + 1U >> 1));
          bound.super_SmallVectorBase<const_slang::ast::Expression_*>.len =
               bound.super_SmallVectorBase<const_slang::ast::Expression_*>.len + 1) {
        condVal.value.
        super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        .
        super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        .
        super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        .
        super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        .
        super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        .
        super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ._M_u._0_8_ = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::
                      iterator_base<slang::syntax::ExpressionSyntax_*>::dereference
                                ((iterator_base<slang::syntax::ExpressionSyntax_*> *)&bound);
        SmallVectorBase<slang::syntax::ExpressionSyntax_const*>::
        emplace_back<slang::syntax::ExpressionSyntax_const*const&>
                  ((SmallVectorBase<slang::syntax::ExpressionSyntax_const*> *)&expressions,
                   (ExpressionSyntax **)&condVal);
      }
    }
    else {
      local_118 = (ASTContext *)pCVar2[2].super_SyntaxNode.parent;
    }
  }
  bound.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ =
       (pointer)bound.super_SmallVectorBase<const_slang::ast::Expression_*>.firstElement;
  bound.super_SmallVectorBase<const_slang::ast::Expression_*>.len = 0;
  bound.super_SmallVectorBase<const_slang::ast::Expression_*>.cap = 5;
  pAVar11 = (ASTContext *)0x73;
  expressions_00._M_extent._M_extent_value = (size_t)&bound;
  expressions_00._M_ptr =
       (pointer)expressions.super_SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>.len;
  bVar5 = Expression::bindMembershipExpressions
                    ((Expression *)context,(ASTContext *)0x73,Unknown,false,true,true,
                     SUB81((syntax->condition).ptr,0),
                     (ExpressionSyntax *)
                     expressions.super_SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>.
                     data_,expressions_00,(SmallVectorBase<const_slang::ast::Expression_*> *)context
                    );
  ppEVar9 = bound.super_SmallVectorBase<const_slang::ast::Expression_*>.data_;
  if (!bVar5) goto LAB_002e9227;
  expr = *bound.super_SmallVectorBase<const_slang::ast::Expression_*>.data_;
  pAVar11 = context;
  ASTContext::eval(&condVal,context,expr,(bitmask<slang::ast::EvalFlags>)0x0);
  if (condVal.value.
      super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ._M_index == '\0') {
    if (expr->kind == TypeReference) {
      local_180 = *(Type **)(expr + 1);
      goto LAB_002e8f55;
    }
  }
  else {
    local_180 = (Type *)0x0;
LAB_002e8f55:
    ppEVar9 = ppEVar9 + 1;
    ppCVar8 = (syntax->items).super_span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>.
              _M_ptr;
    ppCVar1 = ppCVar8 + (syntax->items).
                        super_span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>.
                        _M_extent._M_extent_value;
    attributes = &(syntax->super_MemberSyntax).attributes;
    local_130 = (SourceLocation)0x0;
    local_138 = (SourceLocation)0x0;
    bVar10 = false;
    bVar5 = false;
    for (; ppCVar8 != ppCVar1; ppCVar8 = ppCVar8 + 1) {
      pCVar2 = *ppCVar8;
      if ((pCVar2->super_SyntaxNode).kind == StandardCaseItem) {
        local_148 = (SourceLocation)0x0;
        local_150 = (SourceLocation)0x0;
        bVar4 = false;
        for (uVar12 = 0; uVar12 < *(long *)&pCVar2[3].super_SyntaxNode + 1U >> 1;
            uVar12 = uVar12 + 1) {
          expr_00 = *ppEVar9;
          ASTContext::eval(&val,pAVar11,expr_00,(bitmask<slang::ast::EvalFlags>)0x0);
          if (val.value.
              super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              ._M_index == '\0') {
            if (local_180 != (Type *)0x0) {
              bVar6 = false;
              goto LAB_002e904b;
            }
          }
          else {
            bVar6 = slang::operator==(&val,&condVal);
            if ((val.value.
                 super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                 .
                 super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                 .
                 super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                 .
                 super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                 .
                 super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                 .
                 super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                 ._M_index == '\0') && (local_180 != (Type *)0x0)) {
LAB_002e904b:
              if (expr_00->kind == TypeReference) {
                bVar6 = Type::isMatching(*(Type **)(expr_00 + 1),local_180);
              }
            }
            if ((!bVar4) && (bVar6 != false)) {
              local_148 = (expr_00->sourceRange).startLoc;
              local_150 = (expr_00->sourceRange).endLoc;
              bVar4 = true;
            }
          }
          ppEVar9 = ppEVar9 + 1;
          std::__detail::__variant::
          _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               *)&val);
        }
        if (bVar4) {
          if (!bVar5) {
            bVar5 = true;
            createCondGenBlock(compilation,*(SyntaxNode **)&pCVar2[4].super_SyntaxNode,pAVar11,
                               constructIndex,isUninstantiated,attributes,results);
            local_130 = local_150;
            local_138 = local_148;
            goto LAB_002e919e;
          }
          bVar4 = !bVar10;
          bVar10 = true;
          if (bVar4) {
            sourceRange.endLoc = local_150;
            sourceRange.startLoc = local_148;
            pDVar7 = ASTContext::addDiag(pAVar11,(DiagCode)0xe80006,sourceRange);
            Diagnostic::operator<<(pDVar7,&condVal);
            range.endLoc = local_130;
            range.startLoc = local_138;
            Diagnostic::addNote(pDVar7,(DiagCode)0xb0001,range);
          }
        }
        createCondGenBlock(compilation,*(SyntaxNode **)&pCVar2[4].super_SyntaxNode,pAVar11,
                           constructIndex,true,attributes,results);
      }
LAB_002e919e:
    }
    if (local_118 == (ASTContext *)0x0) {
      context = local_118;
      if (bVar5 == false) {
        pDVar7 = ASTContext::addDiag(pAVar11,(DiagCode)0xe90006,expr->sourceRange);
        context = (ASTContext *)&condVal;
        Diagnostic::operator<<(pDVar7,(ConstantValue *)context);
      }
    }
    else {
      createCondGenBlock(compilation,(SyntaxNode *)local_118,pAVar11,constructIndex,
                         (bool)(isUninstantiated | bVar5),attributes,results);
      context = local_118;
    }
  }
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       *)&condVal);
  pAVar11 = context;
LAB_002e9227:
  SmallVectorBase<const_slang::ast::Expression_*>::cleanup
            (&bound.super_SmallVectorBase<const_slang::ast::Expression_*>,(EVP_PKEY_CTX *)pAVar11);
  SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>::cleanup
            (&expressions.super_SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>,
             (EVP_PKEY_CTX *)pAVar11);
  return;
}

Assistant:

void GenerateBlockSymbol::fromSyntax(Compilation& compilation, const CaseGenerateSyntax& syntax,
                                     const ASTContext& context, uint32_t constructIndex,
                                     bool isUninstantiated,
                                     SmallVectorBase<GenerateBlockSymbol*>& results) {

    SmallVector<const ExpressionSyntax*> expressions;
    const SyntaxNode* defBlock = nullptr;
    for (auto item : syntax.items) {
        switch (item->kind) {
            case SyntaxKind::StandardCaseItem: {
                auto& sci = item->as<StandardCaseItemSyntax>();
                for (auto es : sci.expressions)
                    expressions.push_back(es);
                break;
            }
            case SyntaxKind::DefaultCaseItem:
                // The parser already errored for duplicate defaults,
                // so just ignore if it happens here.
                defBlock = item->as<DefaultCaseItemSyntax>().clause;
                break;
            default:
                SLANG_UNREACHABLE;
        }
    }

    SmallVector<const Expression*> bound;
    if (!Expression::bindMembershipExpressions(
            context, TokenKind::CaseKeyword, /* requireIntegral */ false,
            /* unwrapUnpacked */ false, /* allowTypeReferences */ true, /* allowValueRange */ true,
            *syntax.condition, expressions, bound)) {
        return;
    }

    auto boundIt = bound.begin();
    auto condExpr = *boundIt++;

    const Type* condType = nullptr;
    ConstantValue condVal = context.eval(*condExpr);
    if (!condVal) {
        if (condExpr->kind == ExpressionKind::TypeReference)
            condType = &condExpr->as<TypeReferenceExpression>().targetType;
        else
            return;
    }

    SourceRange matchRange;
    bool found = false;
    bool warned = false;

    for (auto item : syntax.items) {
        if (item->kind != SyntaxKind::StandardCaseItem)
            continue;

        // Check each case expression to see if it matches the condition value.
        bool currentFound = false;
        SourceRange currentMatchRange;
        auto& sci = item->as<StandardCaseItemSyntax>();
        for (size_t i = 0; i < sci.expressions.size(); i++) {
            // Have to keep incrementing the iterator here so that we stay in sync.
            auto expr = *boundIt++;
            ConstantValue val = context.eval(*expr);

            bool match = val && val == condVal;
            if (!val && condType && expr->kind == ExpressionKind::TypeReference)
                match = expr->as<TypeReferenceExpression>().targetType.isMatching(*condType);

            if (!currentFound && match) {
                currentFound = true;
                currentMatchRange = expr->sourceRange;
            }
        }

        if (currentFound && !found) {
            // This is the first match for this entire case generate.
            found = true;
            matchRange = currentMatchRange;
            createCondGenBlock(compilation, *sci.clause, context, constructIndex, isUninstantiated,
                               syntax.attributes, results);
        }
        else {
            // If we previously found a block, this block also matched, which we should warn about.
            if (currentFound && !warned) {
                auto& diag = context.addDiag(diag::CaseGenerateDup, currentMatchRange);
                diag << condVal;
                diag.addNote(diag::NotePreviousMatch, matchRange);
                warned = true;
            }

            // This block is not taken, so create it as uninstantiated.
            createCondGenBlock(compilation, *sci.clause, context, constructIndex, true,
                               syntax.attributes, results);
        }
    }

    if (defBlock) {
        // Only instantiated if no other blocks were instantiated.
        createCondGenBlock(compilation, *defBlock, context, constructIndex,
                           isUninstantiated || found, syntax.attributes, results);
    }
    else if (!found) {
        auto& diag = context.addDiag(diag::CaseGenerateNoBlock, condExpr->sourceRange);
        diag << condVal;
    }
}